

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_perfect_destroy(stb_perfect *p)

{
  if (p->large_bmap != (stb_uint16 *)0x0) {
    free(p->large_bmap);
  }
  if (p->table != (stb_uint32 *)0x0) {
    free(p->table);
  }
  p->large_bmap = (stb_uint16 *)0x0;
  p->table = (stb_uint32 *)0x0;
  p->b_mask = 0;
  p->table_mask = 0;
  return;
}

Assistant:

void stb_perfect_destroy(stb_perfect *p)
{
   if (p->large_bmap) free(p->large_bmap);
   if (p->table     ) free(p->table);
   p->large_bmap = NULL;
   p->table      = NULL;
   p->b_mask     = 0;
   p->table_mask = 0;
}